

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGenerator::AddGlobalTarget_Install
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  cmake *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  pointer pcVar4;
  string *psVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  bool local_701;
  byte local_699;
  allocator<char> local_5e1;
  value_type local_5e0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5b8;
  const_iterator local_5b0;
  undefined1 local_5a8 [8];
  cmCustomCommandLine stripCmdLine;
  string local_588;
  char *local_568;
  char *install_strip;
  allocator<char> local_551;
  value_type local_550;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_530;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_528;
  const_iterator local_520;
  undefined1 local_518 [8];
  cmCustomCommandLine localCmdLine;
  char *install_local;
  value_type local_4f0;
  allocator<char> local_4c9;
  value_type local_4c8;
  byte local_4a2;
  allocator<char> local_4a1;
  undefined1 local_4a0 [6];
  bool useEPN;
  string cfgArg;
  string local_478;
  allocator<char> local_451;
  string local_450;
  cmValue local_430;
  char *local_428;
  allocator<char> local_419;
  string local_418;
  cmValue local_3f8;
  cmValue noall;
  undefined1 local_3e8 [8];
  cmCustomCommandLine singleLine;
  GlobalTargetInfo gti;
  string cmd;
  undefined1 local_2f0 [8];
  GlobalTargetInfo gti_1;
  string local_240;
  undefined1 local_220 [8];
  ostringstream ostr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *componentsSet;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  undefined1 local_29;
  char *pcStack_28;
  bool skipInstallRules;
  char *cmakeCfgIntDir;
  value_type *mf;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *targets_local;
  cmGlobalGenerator *this_local;
  
  mf = (value_type *)targets;
  targets_local =
       (vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        *)this;
  cmakeCfgIntDir =
       (char *)std::
               vector<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ::operator[](&this->Makefiles,0);
  iVar2 = (*this->_vptr_cmGlobalGenerator[0x17])();
  pcStack_28 = (char *)CONCAT44(extraout_var,iVar2);
  pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                     ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"CMAKE_SKIP_INSTALL_RULES",&local_51);
  bVar1 = cmMakefile::IsOn(pcVar4,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  local_29 = bVar1;
  if (((this->InstallTargetEnabled & 1U) == 0) || (!bVar1)) {
    if (((this->InstallTargetEnabled & 1U) != 0) && (!bVar1)) {
      bVar1 = cmNonempty(pcStack_28);
      if ((!bVar1) || (*pcStack_28 == '.')) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
        bVar1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(&this->InstallComponents);
        if (bVar1) {
          std::operator<<((ostream *)local_220,"Only default component available");
        }
        else {
          std::operator<<((ostream *)local_220,"Available install components are: ");
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&gti_1.StdPipesUTF8," ");
          cmWrap<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                    (&local_240,'\"',&this->InstallComponents,'\"',stack0xfffffffffffffdb0);
          std::operator<<((ostream *)local_220,(string *)&local_240);
          std::__cxx11::string::~string((string *)&local_240);
        }
        GlobalTargetInfo::GlobalTargetInfo((GlobalTargetInfo *)local_2f0);
        std::__cxx11::string::operator=((string *)local_2f0,"list_install_components");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=
                  ((string *)(gti_1.Name.field_2._M_local_buf + 8),
                   (string *)(cmd.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
        gti_1.WorkingDir.field_2._M_local_buf[8] = '\0';
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)local_2f0);
        GlobalTargetInfo::~GlobalTargetInfo((GlobalTargetInfo *)local_2f0);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      }
      psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::string((string *)&gti.StdPipesUTF8,(string *)psVar5);
      GlobalTargetInfo::GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1c])();
      std::__cxx11::string::operator=
                ((string *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (char *)CONCAT44(extraout_var_00,iVar2));
      std::__cxx11::string::operator=
                ((string *)(gti.Name.field_2._M_local_buf + 8),"Install the project...");
      gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
      gti.UsesTerminal = true;
      cmCustomCommandLine::cmCustomCommandLine((cmCustomCommandLine *)local_3e8);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1f])();
      if (CONCAT44(extraout_var_01,iVar2) == 0) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",&local_419);
        local_3f8 = cmMakefile::GetDefinition(pcVar4,&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::allocator<char>::~allocator(&local_419);
        bVar1 = cmValue::IsOff(&local_3f8);
        if (bVar1) {
          iVar2 = (*this->_vptr_cmGlobalGenerator[0x1b])();
          local_428 = (char *)CONCAT44(extraout_var_03,iVar2);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &gti.CommandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,&local_428);
        }
      }
      else {
        iVar2 = (*this->_vptr_cmGlobalGenerator[0x1f])();
        noall.Value = (string *)CONCAT44(extraout_var_02,iVar2);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &gti.CommandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&noall);
      }
      pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                         ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir
                         );
      std::allocator<char>::allocator();
      cfgArg.field_2._M_local_buf[0xe] = '\0';
      cfgArg.field_2._M_local_buf[0xd] = '\0';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_450,"CMake_BINARY_DIR",&local_451);
      local_430 = cmMakefile::GetDefinition(pcVar4,&local_450);
      bVar1 = cmValue::operator_cast_to_bool(&local_430);
      local_699 = 0;
      if (bVar1) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        cfgArg.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_478,"CMAKE_CROSSCOMPILING",
                   (allocator<char> *)(cfgArg.field_2._M_local_buf + 0xf));
        cfgArg.field_2._M_local_buf[0xd] = '\x01';
        bVar1 = cmMakefile::IsOn(pcVar4,&local_478);
        local_699 = bVar1 ^ 0xff;
      }
      if ((cfgArg.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_478);
      }
      if ((cfgArg.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(cfgArg.field_2._M_local_buf + 0xf));
      }
      std::__cxx11::string::~string((string *)&local_450);
      std::allocator<char>::~allocator(&local_451);
      if ((local_699 & 1) != 0) {
        std::__cxx11::string::operator=((string *)&gti.StdPipesUTF8,"cmake");
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,(value_type *)&gti.StdPipesUTF8);
      bVar1 = cmNonempty(pcStack_28);
      if ((bVar1) && (*pcStack_28 != '.')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_4a0,"-DBUILD_TYPE=",&local_4a1);
        std::allocator<char>::~allocator(&local_4a1);
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::get
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        uVar3 = (*this->_vptr_cmGlobalGenerator[0x31])(this,pcVar4);
        local_4a2 = (byte)uVar3 & 1;
        if ((uVar3 & 1) == 0) {
          iVar2 = (*this->_vptr_cmGlobalGenerator[0x17])();
          std::__cxx11::string::operator+=
                    ((string *)local_4a0,(char *)CONCAT44(extraout_var_04,iVar2));
        }
        else {
          std::__cxx11::string::operator+=((string *)local_4a0,"$(CONFIGURATION)");
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_3e8,(value_type *)local_4a0);
          std::__cxx11::string::operator=
                    ((string *)local_4a0,"-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_3e8,(value_type *)local_4a0);
        std::__cxx11::string::~string((string *)local_4a0);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"-P",&local_4c9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,&local_4c8);
      std::__cxx11::string::~string((string *)&local_4c8);
      std::allocator<char>::~allocator(&local_4c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4f0,"cmake_install.cmake",
                 (allocator<char> *)((long)&install_local + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_3e8,&local_4f0);
      std::__cxx11::string::~string((string *)&local_4f0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&install_local + 7));
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                 ((long)&gti.Message.field_2 + 8),(value_type *)local_3e8);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                   *)mf,(value_type *)
                        &singleLine.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1d])();
      localCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var_05,iVar2);
      if (localCmdLine.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
        std::__cxx11::string::operator=
                  ((string *)
                   &singleLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (char *)localCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=
                  ((string *)(gti.Name.field_2._M_local_buf + 8),
                   "Installing only the local directory...");
        gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8));
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_518,(cmCustomCommandLine *)local_3e8);
        local_530._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_518);
        local_528 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_530,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_520,&local_528);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_550,"-DCMAKE_INSTALL_LOCAL_ONLY=1",&local_551);
        install_strip =
             (char *)std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_518,local_520,&local_550);
        std::__cxx11::string::~string((string *)&local_550);
        std::allocator<char>::~allocator(&local_551);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8),(value_type *)local_518);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_518);
      }
      iVar2 = (*this->_vptr_cmGlobalGenerator[0x1e])();
      local_568 = (char *)CONCAT44(extraout_var_06,iVar2);
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
      stripCmdLine.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 0;
      local_701 = false;
      if (local_568 != (char *)0x0) {
        pcVar4 = std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
                           ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)
                            cmakeCfgIntDir);
        std::allocator<char>::allocator();
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_588,"CMAKE_STRIP",
                   (allocator<char> *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        stripCmdLine.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ = 1;
        local_701 = cmMakefile::IsSet(pcVar4,&local_588);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ & 1) != 0) {
        std::__cxx11::string::~string((string *)&local_588);
      }
      if ((stripCmdLine.
           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&stripCmdLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      if (local_701 != false) {
        std::__cxx11::string::operator=
                  ((string *)
                   &singleLine.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,local_568);
        std::__cxx11::string::operator=
                  ((string *)(gti.Name.field_2._M_local_buf + 8),
                   "Installing the project stripped...");
        gti.WorkingDir.field_2._M_local_buf[8] = '\x01';
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::clear
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8));
        cmCustomCommandLine::cmCustomCommandLine
                  ((cmCustomCommandLine *)local_5a8,(cmCustomCommandLine *)local_3e8);
        local_5c0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5a8);
        local_5b8 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator+(&local_5c0,1);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_5b0,&local_5b8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_5e0,"-DCMAKE_INSTALL_DO_STRIP=1",&local_5e1);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::insert((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_5a8,local_5b0,&local_5e0);
        std::__cxx11::string::~string((string *)&local_5e0);
        std::allocator<char>::~allocator(&local_5e1);
        std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                  ((vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_> *)
                   ((long)&gti.Message.field_2 + 8),(value_type *)local_5a8);
        std::
        vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
        ::push_back((vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
                     *)mf,(value_type *)
                          &singleLine.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_5a8);
      }
      cmCustomCommandLine::~cmCustomCommandLine((cmCustomCommandLine *)local_3e8);
      GlobalTargetInfo::~GlobalTargetInfo
                ((GlobalTargetInfo *)
                 &singleLine.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string((string *)&gti.StdPipesUTF8);
    }
  }
  else {
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,
               "CMAKE_SKIP_INSTALL_RULES was enabled even though installation rules have been specified"
               ,&local_89);
    std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>::operator->
              ((unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_> *)cmakeCfgIntDir);
    cmMakefile::GetBacktrace((cmMakefile *)&componentsSet);
    cmake::IssueMessage(this_00,WARNING,&local_88,(cmListFileBacktrace *)&componentsSet);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&componentsSet);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_Install(
  std::vector<GlobalTargetInfo>& targets)
{
  auto& mf = this->Makefiles[0];
  const char* cmakeCfgIntDir = this->GetCMakeCFGIntDir();
  bool skipInstallRules = mf->IsOn("CMAKE_SKIP_INSTALL_RULES");
  if (this->InstallTargetEnabled && skipInstallRules) {
    this->CMakeInstance->IssueMessage(
      MessageType::WARNING,
      "CMAKE_SKIP_INSTALL_RULES was enabled even though "
      "installation rules have been specified",
      mf->GetBacktrace());
  } else if (this->InstallTargetEnabled && !skipInstallRules) {
    if (!(cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.')) {
      std::set<std::string>* componentsSet = &this->InstallComponents;
      std::ostringstream ostr;
      if (!componentsSet->empty()) {
        ostr << "Available install components are: ";
        ostr << cmWrap('"', *componentsSet, '"', " ");
      } else {
        ostr << "Only default component available";
      }
      GlobalTargetInfo gti;
      gti.Name = "list_install_components";
      gti.Message = ostr.str();
      gti.UsesTerminal = false;
      targets.push_back(std::move(gti));
    }
    std::string cmd = cmSystemTools::GetCMakeCommand();
    GlobalTargetInfo gti;
    gti.Name = this->GetInstallTargetName();
    gti.Message = "Install the project...";
    gti.UsesTerminal = true;
    gti.StdPipesUTF8 = true;
    cmCustomCommandLine singleLine;
    if (this->GetPreinstallTargetName()) {
      gti.Depends.emplace_back(this->GetPreinstallTargetName());
    } else {
      cmValue noall = mf->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
      if (noall.IsOff()) {
        gti.Depends.emplace_back(this->GetAllTargetName());
      }
    }
    if (mf->GetDefinition("CMake_BINARY_DIR") &&
        !mf->IsOn("CMAKE_CROSSCOMPILING")) {
      // We are building CMake itself.  We cannot use the original
      // executable to install over itself.  The generator will
      // automatically convert this name to the build-time location.
      cmd = "cmake";
    }
    singleLine.push_back(cmd);
    if (cmNonempty(cmakeCfgIntDir) && cmakeCfgIntDir[0] != '.') {
      std::string cfgArg = "-DBUILD_TYPE=";
      bool useEPN = this->UseEffectivePlatformName(mf.get());
      if (useEPN) {
        cfgArg += "$(CONFIGURATION)";
        singleLine.push_back(cfgArg);
        cfgArg = "-DEFFECTIVE_PLATFORM_NAME=$(EFFECTIVE_PLATFORM_NAME)";
      } else {
        cfgArg += this->GetCMakeCFGIntDir();
      }
      singleLine.push_back(cfgArg);
    }
    singleLine.push_back("-P");
    singleLine.push_back("cmake_install.cmake");
    gti.CommandLines.push_back(singleLine);
    targets.push_back(gti);

    // install_local
    if (const char* install_local = this->GetInstallLocalTargetName()) {
      gti.Name = install_local;
      gti.Message = "Installing only the local directory...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine localCmdLine = singleLine;

      localCmdLine.insert(localCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_LOCAL_ONLY=1");

      gti.CommandLines.push_back(std::move(localCmdLine));
      targets.push_back(gti);
    }

    // install_strip
    const char* install_strip = this->GetInstallStripTargetName();
    if ((install_strip != nullptr) && (mf->IsSet("CMAKE_STRIP"))) {
      gti.Name = install_strip;
      gti.Message = "Installing the project stripped...";
      gti.UsesTerminal = true;
      gti.CommandLines.clear();

      cmCustomCommandLine stripCmdLine = singleLine;

      stripCmdLine.insert(stripCmdLine.begin() + 1,
                          "-DCMAKE_INSTALL_DO_STRIP=1");
      gti.CommandLines.push_back(std::move(stripCmdLine));
      targets.push_back(gti);
    }
  }
}